

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>
::
emplace_new_key<std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
          (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          basic_string_view<char,_std::char_traits<char>_> *key,Symbol **args)

{
  long lVar1;
  long lVar2;
  Symbol *pSVar3;
  char *pcVar4;
  Symbol *pSVar5;
  char cVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar10;
  EntryPointer psVar11;
  size_t num_buckets;
  EntryPointer psVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_bool>
  pVar16;
  basic_string_view<char,_std::char_traits<char>_> __tmp_1;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*> local_48;
  size_t local_28;
  char *pcStack_20;
  undefined7 uVar9;
  
  lVar2 = *(long *)(this + 8);
  if ((lVar2 != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>
       )distance_from_desired)) {
    lVar7 = *(long *)(this + 0x18) + 1;
    auVar14._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar14._0_8_ = lVar7;
    auVar14._12_4_ = 0x45300000;
    lVar1 = lVar2 + 1;
    auVar15._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar15._0_8_ = lVar1;
    auVar15._12_4_ = 0x45300000;
    if ((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar15._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
      cVar6 = current_entry->distance_from_desired;
      uVar9 = (undefined7)((ulong)lVar1 >> 8);
      uVar8 = CONCAT71(uVar9,cVar6);
      if (cVar6 < '\0') {
        pcVar4 = key->_M_str;
        (current_entry->field_1).value.first._M_len = key->_M_len;
        (current_entry->field_1).value.first._M_str = pcVar4;
        (current_entry->field_1).value.second = *args;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        sVar10 = key->_M_len;
        pcVar4 = key->_M_str;
        pSVar3 = *args;
        current_entry->distance_from_desired = distance_from_desired;
        local_48.first._M_len = (current_entry->field_1).value.first._M_len;
        local_48.first._M_str = (current_entry->field_1).value.first._M_str;
        (current_entry->field_1).value.first._M_len = sVar10;
        (current_entry->field_1).value.first._M_str = pcVar4;
        pSVar5 = (current_entry->field_1).value.second;
        (current_entry->field_1).value.second = pSVar3;
        uVar8 = CONCAT71(uVar9,cVar6 + '\x01');
        psVar11 = current_entry + 1;
        uVar13 = CONCAT31((int3)((ulong)args >> 8),current_entry[1].distance_from_desired);
        psVar12 = current_entry;
        if (-1 < current_entry[1].distance_from_desired) {
          do {
            psVar12 = psVar11;
            cVar6 = (char)uVar8;
            if ((char)uVar13 < cVar6) {
              psVar12->distance_from_desired = cVar6;
              sVar10 = (psVar12->field_1).value.first._M_len;
              pcVar4 = (psVar12->field_1).value.first._M_str;
              (psVar12->field_1).value.first._M_len = local_48.first._M_len;
              (psVar12->field_1).value.first._M_str = local_48.first._M_str;
              pSVar3 = (psVar12->field_1).value.second;
              (psVar12->field_1).value.second = pSVar5;
              uVar13 = CONCAT31((int3)(uVar13 >> 8),(char)uVar13 + '\x01');
              uVar8 = (ulong)uVar13;
              pSVar5 = pSVar3;
              local_48.first._M_len = sVar10;
              local_48.first._M_str = pcVar4;
            }
            else {
              uVar8 = CONCAT71((int7)(uVar8 >> 8),cVar6 + '\x01');
              if ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>
                   )(cVar6 + '\x01') == this[0x11]) {
                local_28 = local_48.first._M_len;
                pcStack_20 = local_48.first._M_str;
                sVar10 = (current_entry->field_1).value.first._M_len;
                pcVar4 = (current_entry->field_1).value.first._M_str;
                (current_entry->field_1).value.first._M_len = local_48.first._M_len;
                (current_entry->field_1).value.first._M_str = local_48.first._M_str;
                local_48.second = (current_entry->field_1).value.second;
                (current_entry->field_1).value.second = pSVar5;
                uVar8 = *(long *)(this + 8) * 2 + 2;
                num_buckets = 4;
                if (4 < uVar8) {
                  num_buckets = uVar8;
                }
                local_48.first._M_len = sVar10;
                local_48.first._M_str = pcVar4;
                sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                ::rehash((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                          *)this,num_buckets);
                pVar16 = emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>
                                   (this,&local_48);
                return pVar16;
              }
            }
            uVar13 = CONCAT31((int3)(uVar13 >> 8),psVar12[1].distance_from_desired);
            psVar11 = psVar12 + 1;
          } while (-1 < psVar12[1].distance_from_desired);
        }
        psVar12[1].field_1.value.second = pSVar5;
        psVar12[1].field_1.value.first._M_len = local_48.first._M_len;
        psVar12[1].field_1.value.first._M_str = local_48.first._M_str;
        psVar11->distance_from_desired = (int8_t)uVar8;
      }
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
      pVar16._9_7_ = (int7)(uVar8 >> 8);
      pVar16.second = true;
      pVar16.first.current = current_entry;
      return pVar16;
    }
  }
  uVar8 = lVar2 * 2 + 2;
  sVar10 = 4;
  if (4 < uVar8) {
    sVar10 = uVar8;
  }
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  ::rehash((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
            *)this,sVar10);
  pVar16 = emplace<std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                     (this,key,args);
  return pVar16;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }